

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O0

void __thiscall Colony::~Colony(Colony *this)

{
  void *pvVar1;
  ostream *this_00;
  undefined8 *in_RDI;
  Graph *unaff_retaddr;
  int i;
  int local_c;
  
  *in_RDI = &PTR__Colony_0011cd40;
  this_00 = std::operator<<((ostream *)&std::cout,"destructor!!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  for (local_c = 0; local_c < *(int *)((long)in_RDI + 0xc); local_c = local_c + 1) {
    pvVar1 = *(void **)(in_RDI[5] + (long)local_c * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    *(undefined8 *)(in_RDI[5] + (long)local_c * 8) = 0;
    pvVar1 = *(void **)(in_RDI[6] + (long)local_c * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    *(undefined8 *)(in_RDI[6] + (long)local_c * 8) = 0;
  }
  if ((void *)in_RDI[5] != (void *)0x0) {
    operator_delete__((void *)in_RDI[5]);
  }
  in_RDI[5] = 0;
  if ((void *)in_RDI[6] != (void *)0x0) {
    operator_delete__((void *)in_RDI[6]);
  }
  in_RDI[6] = 0;
  Graph::~Graph(unaff_retaddr);
  return;
}

Assistant:

Colony::~Colony()
{ 
	std::cout << "destructor!!" << std::endl;
	for(int i = 0; i < num_node; i++){
		delete[] phero_matrix[i];
		phero_matrix[i] = nullptr;
		delete[] etha_matrix[i];
		etha_matrix[i] = nullptr;
	}
	delete[] phero_matrix;
	phero_matrix = nullptr;
	delete[] etha_matrix;
	etha_matrix = nullptr;
}